

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long *in_RDX;
  long *in_RSI;
  Option *in_RDI;
  bool bVar10;
  int i;
  float *outptr;
  char *ptr;
  int q;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *in_stack_000001e0;
  Mat *in_stack_000001e8;
  Cast *in_stack_000001f0;
  Mat *m_1;
  size_t in_stack_fffffffffffffc98;
  Allocator *in_stack_fffffffffffffca0;
  int _d;
  size_t in_stack_fffffffffffffca8;
  int _w;
  Mat *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  int _w_00;
  Mat *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffd10;
  int local_2ec;
  Allocator *in_stack_fffffffffffffd18;
  Allocator *in_stack_fffffffffffffd20;
  Option *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdc0;
  int local_238;
  undefined4 in_stack_fffffffffffffdd8;
  int iVar11;
  Mat *top_blob_00;
  undefined4 in_stack_fffffffffffffde8;
  int iVar12;
  Option *opt_00;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int iVar13;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  
  if (*(int *)&in_RDI[3].workspace_allocator == *(int *)((long)&in_RDI[3].workspace_allocator + 4))
  {
    if (in_RDX != in_RSI) {
      if (in_RSI[1] != 0) {
        LOCK();
        *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
        UNLOCK();
      }
      if (in_RDX[1] != 0) {
        piVar2 = (int *)in_RDX[1];
        LOCK();
        iVar13 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar13 == 1) {
          if (in_RDX[4] == 0) {
            if ((void *)*in_RDX != (void *)0x0) {
              free((void *)*in_RDX);
            }
          }
          else {
            (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
          }
        }
      }
      *in_RDX = 0;
      in_RDX[2] = 0;
      *(undefined4 *)(in_RDX + 3) = 0;
      *(undefined4 *)(in_RDX + 5) = 0;
      *(undefined4 *)((long)in_RDX + 0x2c) = 0;
      *(undefined4 *)(in_RDX + 6) = 0;
      *(undefined4 *)((long)in_RDX + 0x34) = 0;
      *(undefined4 *)(in_RDX + 7) = 0;
      in_RDX[8] = 0;
      in_RDX[1] = 0;
      *in_RDX = *in_RSI;
      in_RDX[1] = in_RSI[1];
      in_RDX[2] = in_RSI[2];
      *(int *)(in_RDX + 3) = (int)in_RSI[3];
      in_RDX[4] = in_RSI[4];
      *(int *)(in_RDX + 5) = (int)in_RSI[5];
      *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
      *(int *)(in_RDX + 6) = (int)in_RSI[6];
      *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
      *(int *)(in_RDX + 7) = (int)in_RSI[7];
      in_RDX[8] = in_RSI[8];
    }
    iVar13 = 0;
  }
  else {
    iVar13 = *(int *)((long)in_RSI + 0x2c);
    lVar8 = in_RSI[6];
    iVar1 = *(int *)((long)in_RSI + 0x34);
    lVar9 = in_RSI[7];
    iVar12 = (int)in_RSI[5];
    top_blob_00 = (Mat *)in_RSI[2];
    iVar11 = (int)in_RSI[3];
    opt_00 = in_RDI;
    if ((*(int *)((long)&in_RDI[3].workspace_allocator + 4) == 1) &&
       (*(int *)&in_RDI[3].workspace_allocator == 3)) {
      Cast::forward(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,(Option *)m);
    }
    _w = (int)(in_stack_fffffffffffffca8 >> 0x20);
    _w_00 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    if (iVar12 == 1) {
      Mat::create(in_stack_fffffffffffffcc0,_w_00,(size_t)in_stack_fffffffffffffcb0,_w,
                  in_stack_fffffffffffffca0);
    }
    else if (iVar12 == 2) {
      Mat::create(in_stack_fffffffffffffcc0,_w_00,(int)in_stack_fffffffffffffcb8,
                  (size_t)in_stack_fffffffffffffcb0,_w,in_stack_fffffffffffffca0);
    }
    else {
      _d = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
      if (iVar12 == 3) {
        Mat::create(in_stack_fffffffffffffcc0,_w_00,(int)in_stack_fffffffffffffcb8,
                    (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),in_stack_fffffffffffffca8,_d,
                    in_stack_fffffffffffffd20);
      }
      else if (iVar12 == 4) {
        Mat::create(in_stack_fffffffffffffcb0,_w,(int)in_stack_fffffffffffffca8,_d,
                    (int)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                    in_stack_fffffffffffffd10,in_stack_fffffffffffffd18);
      }
    }
    bVar10 = true;
    if (*in_RDX != 0) {
      bVar10 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
    }
    if (bVar10) {
      iVar13 = -100;
    }
    else {
      iVar13 = iVar13 * (int)lVar8 * iVar1 * iVar11;
      if ((*(int *)&in_RDI[3].workspace_allocator == 1) &&
         (*(int *)((long)&in_RDI[3].workspace_allocator + 4) == 2)) {
        cast_fp32_to_fp16_sse
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      }
      if ((*(int *)&in_RDI[3].workspace_allocator == 2) &&
         (*(int *)((long)&in_RDI[3].workspace_allocator + 4) == 1)) {
        cast_fp16_to_fp32_sse
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      }
      if ((*(int *)&in_RDI[3].workspace_allocator == 3) &&
         (*(int *)((long)&in_RDI[3].workspace_allocator + 4) == 1)) {
        for (local_238 = 0; local_238 < (int)lVar9; local_238 = local_238 + 1) {
          lVar8 = *in_RSI;
          lVar3 = in_RSI[8];
          lVar4 = in_RSI[2];
          lVar5 = *in_RDX;
          lVar6 = in_RDX[8];
          lVar7 = in_RDX[2];
          for (local_2ec = 0; local_2ec < iVar13; local_2ec = local_2ec + 1) {
            *(float *)(lVar5 + lVar6 * local_238 * lVar7 + (long)local_2ec * 4) =
                 (float)(int)*(char *)(lVar8 + lVar3 * local_238 * lVar4 + (long)local_2ec);
          }
        }
      }
      if ((*(int *)&in_RDI[3].workspace_allocator == 1) &&
         (*(int *)((long)&in_RDI[3].workspace_allocator + 4) == 4)) {
        cast_fp32_to_bf16_sse
                  ((Mat *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),opt_00);
      }
      if ((*(int *)&in_RDI[3].workspace_allocator == 4) &&
         (*(int *)((long)&in_RDI[3].workspace_allocator + 4) == 1)) {
        cast_bf16_to_fp32_sse
                  ((Mat *)CONCAT44(iVar12,in_stack_fffffffffffffde8),top_blob_00,
                   (Option *)CONCAT44(iVar11,in_stack_fffffffffffffdd8));
      }
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}